

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSkip.cpp
# Opt level: O0

void __thiscall NaPNSkip::post_action(NaPNSkip *this)

{
  uint uVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NaPetriNode *in_RDI;
  
  NaPetriCnInput::commit_data((NaPetriCnInput *)in_RDI);
  uVar1 = NaPetriNode::activations(in_RDI);
  if (*(uint *)&in_RDI[5].pcaPorts.pHead < uVar1) {
    NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x176834);
  }
  uVar1 = NaPetriNode::activations(in_RDI);
  if (*(uint *)&in_RDI[5].pcaPorts.pHead < uVar1) {
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(undefined8 *)CONCAT44(extraout_var,iVar2) = 0x3ff0000000000000;
  }
  else {
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(undefined8 *)CONCAT44(extraout_var_00,iVar2) = 0xbff0000000000000;
  }
  NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x1768ae);
  return;
}

Assistant:

void
NaPNSkip::post_action ()
{
  // Commit input anyway to get next data portion
  in.commit_data();

  if(activations() > nSkip)
    // Commit output only if given number of portions were skipped
    out.commit_data();

  if(activations() > nSkip)
    sync.data()[0] = 1;
  else
    sync.data()[0] = -1;

  // Commit synchronization
  sync.commit_data();
}